

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_hash.c
# Opt level: O0

lzma_ret lzma_index_hash_append
                   (lzma_index_hash *index_hash,lzma_vli unpadded_size,lzma_vli uncompressed_size)

{
  lzma_vli lVar1;
  lzma_ret ret_;
  lzma_vli uncompressed_size_local;
  lzma_vli unpadded_size_local;
  lzma_index_hash *index_hash_local;
  
  if ((((index_hash->sequence == SEQ_BLOCK) && (4 < unpadded_size)) &&
      (unpadded_size < 0x7ffffffffffffffd)) && (uncompressed_size < 0x8000000000000000)) {
    index_hash_local._4_4_ = hash_append(&index_hash->blocks,unpadded_size,uncompressed_size);
    if (index_hash_local._4_4_ == LZMA_OK) {
      if ((((index_hash->blocks).blocks_size < 0x8000000000000000) &&
          ((index_hash->blocks).uncompressed_size < 0x8000000000000000)) &&
         ((lVar1 = index_size((index_hash->blocks).count,(index_hash->blocks).index_list_size),
          lVar1 < 0x400000001 &&
          (lVar1 = index_stream_size((index_hash->blocks).blocks_size,(index_hash->blocks).count,
                                     (index_hash->blocks).index_list_size),
          lVar1 < 0x8000000000000000)))) {
        index_hash_local._4_4_ = LZMA_OK;
      }
      else {
        index_hash_local._4_4_ = LZMA_DATA_ERROR;
      }
    }
  }
  else {
    index_hash_local._4_4_ = LZMA_PROG_ERROR;
  }
  return index_hash_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_index_hash_append(lzma_index_hash *index_hash, lzma_vli unpadded_size,
		lzma_vli uncompressed_size)
{
	// Validate the arguments.
	if (index_hash->sequence != SEQ_BLOCK
			|| unpadded_size < UNPADDED_SIZE_MIN
			|| unpadded_size > UNPADDED_SIZE_MAX
			|| uncompressed_size > LZMA_VLI_MAX)
		return LZMA_PROG_ERROR;

	// Update the hash.
	return_if_error(hash_append(&index_hash->blocks,
			unpadded_size, uncompressed_size));

	// Validate the properties of *info are still in allowed limits.
	if (index_hash->blocks.blocks_size > LZMA_VLI_MAX
			|| index_hash->blocks.uncompressed_size > LZMA_VLI_MAX
			|| index_size(index_hash->blocks.count,
					index_hash->blocks.index_list_size)
				> LZMA_BACKWARD_SIZE_MAX
			|| index_stream_size(index_hash->blocks.blocks_size,
					index_hash->blocks.count,
					index_hash->blocks.index_list_size)
				> LZMA_VLI_MAX)
		return LZMA_DATA_ERROR;

	return LZMA_OK;
}